

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O1

void HTS_Engine_save_label(HTS_Engine *engine,FILE *fp)

{
  HTS_Label *label;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  undefined8 in_R9;
  size_t sVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  long lVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  
  label = &engine->label;
  sVar1 = HTS_ModelSet_get_nstate(&engine->ms);
  sVar9 = (engine->condition).fperiod;
  uVar17 = 0;
  sVar8 = (engine->condition).sampling_frequency;
  uVar16 = 0;
  sVar2 = HTS_Label_get_size(label);
  if (sVar2 != 0) {
    dVar14 = ((((double)CONCAT44(0x45300000,(int)(sVar9 >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar9) - 4503599627370496.0)) * 10000000.0) /
             (((double)CONCAT44(0x45300000,(int)(sVar8 >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0));
    sVar8 = 0;
    lVar15 = 0;
    sVar9 = 0;
    do {
      sVar2 = sVar1;
      if (sVar1 == 0) {
        lVar7 = 0;
      }
      else {
        lVar7 = 0;
        sVar3 = sVar9;
        do {
          sVar9 = sVar3 + 1;
          sVar3 = HTS_SStreamSet_get_duration(&engine->sss,sVar3);
          lVar7 = lVar7 + sVar3;
          sVar1 = sVar1 - 1;
          sVar3 = sVar9;
        } while (sVar1 != 0);
      }
      auVar10._8_4_ = (int)((ulong)lVar15 >> 0x20);
      auVar10._0_8_ = lVar15;
      auVar10._12_4_ = 0x45300000;
      dVar12 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)) * dVar14;
      uVar4 = (ulong)dVar12;
      lVar15 = lVar15 + lVar7;
      auVar11._8_4_ = (int)((ulong)lVar15 >> 0x20);
      auVar11._0_8_ = lVar15;
      auVar11._12_4_ = 0x45300000;
      dVar13 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)) * dVar14;
      uVar6 = (ulong)dVar13;
      pcVar5 = HTS_Label_get_string(label,sVar8);
      fprintf((FILE *)fp,"%lu %lu %s\n",
              (long)(dVar12 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4,
              (long)(dVar13 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6,pcVar5,in_R9,
              lVar15,uVar16,sVar2,uVar17);
      sVar8 = sVar8 + 1;
      sVar3 = HTS_Label_get_size(label);
      sVar1 = sVar2;
    } while (sVar8 < sVar3);
  }
  return;
}

Assistant:

void HTS_Engine_save_label(HTS_Engine * engine, FILE * fp)
{
   size_t i, j;
   size_t frame, state, duration;

   HTS_Label *label = &engine->label;
   HTS_SStreamSet *sss = &engine->sss;
   size_t nstate = HTS_ModelSet_get_nstate(&engine->ms);
   double rate = engine->condition.fperiod * 1.0e+07 / engine->condition.sampling_frequency;

   for (i = 0, state = 0, frame = 0; i < HTS_Label_get_size(label); i++) {
      for (j = 0, duration = 0; j < nstate; j++)
         duration += HTS_SStreamSet_get_duration(sss, state++);
      fprintf(fp, "%lu %lu %s\n", (unsigned long) (frame * rate), (unsigned long) ((frame + duration) * rate), HTS_Label_get_string(label, i));
      frame += duration;
   }
}